

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

basic_json_pointer<char> *
jsoncons::jsonpointer::operator+(basic_json_pointer<char> *lhs,basic_json_pointer<char> *rhs)

{
  basic_json_pointer<char> *in_RDI;
  basic_json_pointer<char> *p;
  basic_json_pointer<char> *in_stack_ffffffffffffffb8;
  basic_json_pointer<char> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  basic_json_pointer<char>::basic_json_pointer(in_RDI,in_stack_ffffffffffffffb8);
  basic_json_pointer<char>::operator+=
            ((basic_json_pointer<char> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

basic_json_pointer<CharT> operator+( const basic_json_pointer<CharT>& lhs, const basic_json_pointer<CharT>& rhs )
        {
            basic_json_pointer<CharT> p(lhs);
            p += rhs;
            return p;
        }